

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O2

void __thiscall Assimp::Discreet3DSImporter::ReplaceDefaultMaterial(Discreet3DSImporter *this)

{
  ai_real *paVar1;
  float fVar2;
  pointer pMVar3;
  int iVar4;
  ulong uVar5;
  _Alloc_hider _Var6;
  long lVar7;
  Logger *pLVar8;
  Scene *pSVar9;
  uint *puVar10;
  _Alloc_hider _Var11;
  uint uVar12;
  ulong uVar13;
  pointer pMVar14;
  string *psVar15;
  uint local_318;
  allocator local_311;
  Discreet3DSImporter *local_310;
  string local_308;
  Material local_2e8;
  
  local_318 = 0xcdcdcdcd;
  uVar12 = 0;
  local_310 = this;
  while( true ) {
    uVar13 = (ulong)uVar12;
    pSVar9 = local_310->mScene;
    pMVar3 = (pSVar9->mMaterials).
             super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar5 = ((long)(pSVar9->mMaterials).
                   super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar3) / 0x2b8;
    if (uVar5 <= uVar13) break;
    psVar15 = &pMVar3[uVar13].mName;
    _Var6._M_p = (psVar15->_M_dataplus)._M_p;
    for (_Var11._M_p = _Var6._M_p; _Var11._M_p != _Var6._M_p + pMVar3[uVar13].mName._M_string_length
        ; _Var11._M_p = _Var11._M_p + 1) {
      iVar4 = tolower((int)*_Var11._M_p);
      *_Var11._M_p = (char)iVar4;
      _Var6._M_p = (psVar15->_M_dataplus)._M_p;
    }
    lVar7 = std::__cxx11::string::find((char *)psVar15,0x63b432);
    if (lVar7 != -1) {
      pMVar3 = (local_310->mScene->mMaterials).
               super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
               _M_impl.super__Vector_impl_data._M_start;
      fVar2 = pMVar3[uVar13].mDiffuse.r;
      if (fVar2 == pMVar3[uVar13].mDiffuse.g) {
        paVar1 = &pMVar3[uVar13].mDiffuse.b;
        if (((((fVar2 == *paVar1) && (!NAN(fVar2) && !NAN(*paVar1))) &&
             (*(size_type *)((long)&pMVar3[uVar13].sTexDiffuse.mMapName + 8) == 0)) &&
            ((*(size_type *)((long)&pMVar3[uVar13].sTexBump.mMapName + 8) == 0 &&
             (*(size_type *)((long)&pMVar3[uVar13].sTexOpacity.mMapName + 8) == 0)))) &&
           ((*(size_type *)((long)&pMVar3[uVar13].sTexEmissive.mMapName + 8) == 0 &&
            ((*(size_type *)((long)&pMVar3[uVar13].sTexSpecular.mMapName + 8) == 0 &&
             (*(size_type *)((long)&pMVar3[uVar13].sTexShininess.mMapName + 8) == 0)))))) {
          local_318 = uVar12;
        }
      }
    }
    uVar12 = uVar12 + 1;
  }
  uVar12 = (uint)uVar5;
  if (local_318 != 0xcdcdcdcd) {
    uVar12 = local_318;
  }
  pMVar14 = (pSVar9->mMeshes).
            super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar4 = 0;
  do {
    if (pMVar14 ==
        (pSVar9->mMeshes).
        super__Vector_base<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if ((iVar4 != 0) &&
         (((long)(pSVar9->mMaterials).
                 super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pSVar9->mMaterials).
                super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x2b8 == (ulong)uVar12)) {
        std::__cxx11::string::string((string *)&local_308,"%%%DEFAULT",&local_311);
        D3DS::Material::Material(&local_2e8,&local_308);
        std::__cxx11::string::~string((string *)&local_308);
        local_2e8.mDiffuse.r = 0.3;
        local_2e8.mDiffuse.g = 0.3;
        local_2e8.mDiffuse.b = 0.3;
        std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::push_back
                  (&local_310->mScene->mMaterials,&local_2e8);
        pLVar8 = DefaultLogger::get();
        Logger::info(pLVar8,"3DS: Generating default material");
        D3DS::Material::~Material(&local_2e8);
      }
      return;
    }
    for (puVar10 = (pMVar14->mFaceMaterials).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        puVar10 !=
        (pMVar14->mFaceMaterials).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish; puVar10 = puVar10 + 1) {
      if ((ulong)*puVar10 == 0xcdcdcdcd) {
        *puVar10 = uVar12;
LAB_005f70b0:
        iVar4 = iVar4 + 1;
      }
      else if ((ulong)(((long)(local_310->mScene->mMaterials).
                              super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_310->mScene->mMaterials).
                             super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x2b8) <= (ulong)*puVar10)
      {
        *puVar10 = uVar12;
        pLVar8 = DefaultLogger::get();
        Logger::warn(pLVar8,"Material index overflow in 3DS file. Using default material");
        goto LAB_005f70b0;
      }
    }
    pMVar14 = pMVar14 + 1;
    pSVar9 = local_310->mScene;
  } while( true );
}

Assistant:

void Discreet3DSImporter::ReplaceDefaultMaterial()
{
    // Try to find an existing material that matches the
    // typical default material setting:
    // - no textures
    // - diffuse color (in grey!)
    // NOTE: This is here to workaround the fact that some
    // exporters are writing a default material, too.
    unsigned int idx( NotSet );
    for (unsigned int i = 0; i < mScene->mMaterials.size();++i)
    {
        std::string &s = mScene->mMaterials[i].mName;
        for ( std::string::iterator it = s.begin(); it != s.end(); ++it ) {
            *it = static_cast< char >( ::tolower( *it ) );
        }

        if (std::string::npos == s.find("default"))continue;

        if (mScene->mMaterials[i].mDiffuse.r !=
            mScene->mMaterials[i].mDiffuse.g ||
            mScene->mMaterials[i].mDiffuse.r !=
            mScene->mMaterials[i].mDiffuse.b)continue;

        if (mScene->mMaterials[i].sTexDiffuse.mMapName.length()   != 0  ||
            mScene->mMaterials[i].sTexBump.mMapName.length()      != 0  ||
            mScene->mMaterials[i].sTexOpacity.mMapName.length()   != 0  ||
            mScene->mMaterials[i].sTexEmissive.mMapName.length()  != 0  ||
            mScene->mMaterials[i].sTexSpecular.mMapName.length()  != 0  ||
            mScene->mMaterials[i].sTexShininess.mMapName.length() != 0 )
        {
            continue;
        }
        idx = i;
    }
    if ( NotSet == idx ) {
        idx = ( unsigned int )mScene->mMaterials.size();
    }

    // now iterate through all meshes and through all faces and
    // find all faces that are using the default material
    unsigned int cnt = 0;
    for (std::vector<D3DS::Mesh>::iterator
        i =  mScene->mMeshes.begin();
        i != mScene->mMeshes.end();++i)
    {
        for (std::vector<unsigned int>::iterator
            a =  (*i).mFaceMaterials.begin();
            a != (*i).mFaceMaterials.end();++a)
        {
            // NOTE: The additional check seems to be necessary,
            // some exporters seem to generate invalid data here
            if (0xcdcdcdcd == (*a))
            {
                (*a) = idx;
                ++cnt;
            }
            else if ( (*a) >= mScene->mMaterials.size())
            {
                (*a) = idx;
                ASSIMP_LOG_WARN("Material index overflow in 3DS file. Using default material");
                ++cnt;
            }
        }
    }
    if (cnt && idx == mScene->mMaterials.size())
    {
        // We need to create our own default material
        D3DS::Material sMat("%%%DEFAULT");
        sMat.mDiffuse = aiColor3D(0.3f,0.3f,0.3f);
        mScene->mMaterials.push_back(sMat);

        ASSIMP_LOG_INFO("3DS: Generating default material");
    }
}